

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

ssize_t __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,int __fd,void *__buf,size_t __n)

{
  size_t *psVar1;
  ulong uVar2;
  basic_substring<const_char> *this_00;
  ulong uVar3;
  code *pcVar4;
  Location loc;
  Location loc_00;
  Location LVar5;
  Location LVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  error_flags eVar10;
  int iVar11;
  ssize_t sVar12;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  undefined8 uVar13;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  size_t sVar14;
  ssize_t extraout_RAX_04;
  ssize_t extraout_RAX_05;
  ulong uVar15;
  undefined4 in_register_00000034;
  csubstr *pcVar16;
  long lVar18;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  csubstr s;
  csubstr s_00;
  basic_substring<const_char> bVar22;
  char msg [133];
  basic_substring<const_char> local_b8;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  char *pcVar17;
  
  pcVar16 = (csubstr *)CONCAT44(in_register_00000034,__fd);
  if (pcVar16->str != (char *)0x0 && pcVar16->len != 0) {
    _write_tag(this,*pcVar16);
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  uVar19 = (uint)__buf;
  if (((ulong)__buf & 0x300) == 0) {
    if (((ulong)__buf & 0xc0) != 0) {
      iVar11 = basic_substring<const_char>::compare(pcVar16 + 2,"<<",2);
      uVar13 = CONCAT44(extraout_var,iVar11);
      if (iVar11 != 0) {
        uVar13 = std::ostream::put((char)(this->
                                         super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
      sVar14 = pcVar16[2].len;
      if (pcVar16[2].str == (char *)0x0 || sVar14 == 0) {
        return CONCAT71((int7)((ulong)uVar13 >> 8),sVar14 == 0);
      }
      sVar12 = std::ostream::write((char *)((this->
                                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ).m_stream + 0x10),(long)pcVar16[2].str);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar14;
      return sVar12;
    }
  }
  else {
    if (((ulong)__buf & 0xc0) != 0) {
      eVar10 = get_error_flags();
      if (((eVar10 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar4 = (code *)swi(3);
        sVar12 = (*pcVar4)();
        return sVar12;
      }
      local_b8.str = (char *)0x0;
      local_b8.len = 0x5a05;
      local_a8 = 0;
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98 = 0x65;
      loc.super_LineCol.col = 0;
      loc.super_LineCol.offset = SUB168(ZEXT816(0x5a05) << 0x40,0);
      loc.super_LineCol.line = SUB168(ZEXT816(0x5a05) << 0x40,8);
      loc.name.str = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc.name.len = 0x65;
      error("check failed: flags.is_ref() != flags.has_anchor()",0x32,loc);
    }
    if ((pcVar16[2].len == 0) || (pcVar16[2].str == (char *)0x0)) {
      eVar10 = get_error_flags();
      if (((eVar10 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar4 = (code *)swi(3);
        sVar12 = (*pcVar4)();
        return sVar12;
      }
      local_b8.str = (char *)0x0;
      local_b8.len = 0x5a06;
      local_a8 = 0;
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98 = 0x65;
      loc_00.super_LineCol.col = 0;
      loc_00.super_LineCol.offset = SUB168(ZEXT816(0x5a06) << 0x40,0);
      loc_00.super_LineCol.line = SUB168(ZEXT816(0x5a06) << 0x40,8);
      loc_00.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_00.name.len = 0x65;
      error("check failed: ! sc.anchor.empty()",0x21,loc_00);
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    sVar14 = pcVar16[2].len;
    if (pcVar16[2].str != (char *)0x0 && sVar14 != 0) {
      std::ostream::write((char *)((this->
                                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).m_stream + 0x10),(long)pcVar16[2].str);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar14;
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  if ((((ulong)__buf & 0x7fe0000) != 0) &&
     ((((ulong)__buf & 0x2aa0000) == 0) != (((ulong)__buf & 0x5540000) != 0))) {
    memcpy(&local_b8,
           "check failed: (((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)))"
           ,0x85);
    eVar10 = get_error_flags();
    if (((eVar10 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar4 = (code *)swi(3);
      sVar12 = (*pcVar4)();
      return sVar12;
    }
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x5a14) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x5a14) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_tree->m_callbacks).m_error)
              ((char *)&local_b8,0x85,LVar5,(this->m_tree->m_callbacks).m_user_data);
  }
  if (((ulong)__buf & 0x60000) == 0) {
    if (((ulong)__buf & 0x180000) != 0) {
      _write_scalar_folded(this,pcVar16[1],__n,SUB41((uVar19 & 2) >> 1,0));
      return extraout_RAX_00;
    }
    if (((ulong)__buf & 0x600000) != 0) {
      _write_scalar_squo(this,pcVar16[1],__n);
      return extraout_RAX_01;
    }
    if (((ulong)__buf & 0x1800000) != 0) {
      _write_scalar_dquo(this,pcVar16[1],__n);
      return extraout_RAX_02;
    }
    if (((ulong)__buf & 0x6000000) != 0) {
      _write_scalar_plain(this,pcVar16[1],__n);
      return extraout_RAX_03;
    }
    if (((ulong)__buf & 0x7fe0000) != 0) {
      local_b8.str = (char *)0x6c706d6920746f6e;
      local_b8.len._0_1_ = 'e';
      local_b8.len._1_1_ = 'm';
      local_b8.len._2_1_ = 'e';
      local_b8.len._3_1_ = 'n';
      local_b8.len._4_1_ = 't';
      local_b8.len._5_1_ = 'e';
      local_b8.len._6_1_ = 'd';
      local_b8.len._7_1_ = '\0';
      eVar10 = get_error_flags();
      if (((eVar10 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar4 = (code *)swi(3);
        sVar12 = (*pcVar4)();
        return sVar12;
      }
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x5a47) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x5a47) << 0x40,8);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.name.len = 0x65;
      sVar12 = (*(this->m_tree->m_callbacks).m_error)
                         ((char *)&local_b8,0x10,LVar6,(this->m_tree->m_callbacks).m_user_data);
      return sVar12;
    }
    this_00 = pcVar16 + 1;
    bVar8 = false;
    sVar14 = basic_substring<const_char>::first_not_of(this_00,'\n',0);
    if (sVar14 != 0xffffffffffffffff) {
      if (pcVar16[1].len < sVar14) {
        eVar10 = get_error_flags();
        if (((eVar10 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar4 = (code *)swi(3);
          sVar12 = (*pcVar4)();
          return sVar12;
        }
        handle_error(0x21a325,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (&local_b8,pcVar16[1].str + sVar14,pcVar16[1].len - sVar14);
      if (local_b8.len == 0) {
        bVar8 = false;
      }
      else {
        bVar8 = true;
        if (*local_b8.str != ' ') {
          lVar7 = 0;
          do {
            lVar18 = lVar7;
            if (lVar18 == 1) break;
            lVar7 = lVar18 + 1;
          } while (*local_b8.str != " \t"[lVar18 + 1]);
          bVar8 = lVar18 == 0;
        }
      }
    }
    bVar20 = pcVar16[1].len != 0;
    bVar21 = pcVar16[1].str != (char *)0x0;
    bVar9 = (bVar21 && bVar20) && sVar14 == 0xffffffffffffffff;
    if (bVar8 == true && ((!bVar21 || !bVar20) || sVar14 != 0xffffffffffffffff)) {
      bVar22 = basic_substring<const_char>::trim(this_00,' ');
      bVar9 = bVar22.str != (char *)0x0 && bVar22.len != 0;
    }
    if (!bVar9) {
      uVar3 = pcVar16[1].len;
      bVar9 = uVar3 != 0;
      if (bVar9) {
        pcVar17 = this_00->str;
        if (*pcVar17 != '\n') {
          uVar15 = 0;
          do {
            if (uVar3 - 1 == uVar15) goto LAB_001b5e1f;
            uVar2 = uVar15 + 1;
            lVar7 = uVar15 + 1;
            uVar15 = uVar2;
          } while (pcVar17[lVar7] != '\n');
          bVar9 = uVar2 < uVar3;
        }
        s_00.len = uVar3;
        s_00.str = pcVar17;
        _write_scalar_literal(this,s_00,__n,SUB41((uVar19 & 2) >> 1,0),bVar8);
        if (bVar9) {
          return extraout_RAX_04;
        }
      }
LAB_001b5e1f:
      _write_scalar(this,pcVar16[1],(~uVar19 & 0x1001) == 0 || (~uVar19 & 0x2002) == 0);
      return extraout_RAX_05;
    }
    pcVar17 = pcVar16[1].str;
    sVar14 = pcVar16[1].len;
    bVar9 = SUB41((uVar19 & 2) >> 1,0);
  }
  else {
    pcVar17 = pcVar16[1].str;
    sVar14 = pcVar16[1].len;
    bVar9 = SUB41((uVar19 & 2) >> 1,0);
    bVar8 = false;
  }
  s.len = sVar14;
  s.str = pcVar17;
  _write_scalar_literal(this,s,__n,bVar9,bVar8);
  return extraout_RAX;
}

Assistant:

void Emitter<Writer>::_write(NodeScalar const& C4_RESTRICT sc, NodeType flags, size_t ilevel)
{
    if( ! sc.tag.empty())
    {
        _write_tag(sc.tag);
        this->Writer::_do_write(' ');
    }
    if(flags.has_anchor())
    {
        RYML_ASSERT(flags.is_ref() != flags.has_anchor());
        RYML_ASSERT( ! sc.anchor.empty());
        this->Writer::_do_write('&');
        this->Writer::_do_write(sc.anchor);
        this->Writer::_do_write(' ');
    }
    else if(flags.is_ref())
    {
        if(sc.anchor != "<<")
            this->Writer::_do_write('*');
        this->Writer::_do_write(sc.anchor);
        return;
    }

    // ensure the style flags only have one of KEY or VAL
    _RYML_CB_ASSERT(m_tree->callbacks(), ((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)));

    auto style_marks = flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE);
    if(style_marks & (_WIP_KEY_LITERAL|_WIP_VAL_LITERAL))
    {
        _write_scalar_literal(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_FOLDED|_WIP_VAL_FOLDED))
    {
        _write_scalar_folded(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_SQUO|_WIP_VAL_SQUO))
    {
        _write_scalar_squo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_DQUO|_WIP_VAL_DQUO))
    {
        _write_scalar_dquo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_PLAIN|_WIP_VAL_PLAIN))
    {
        _write_scalar_plain(sc.scalar, ilevel);
    }
    else if(!style_marks)
    {
        size_t first_non_nl = sc.scalar.first_not_of('\n');
        bool all_newlines = first_non_nl == npos;
        bool has_leading_ws = (!all_newlines) && sc.scalar.sub(first_non_nl).begins_with_any(" \t");
        bool do_literal = ((!sc.scalar.empty() && all_newlines) || (has_leading_ws && !sc.scalar.trim(' ').empty()));
        if(do_literal)
        {
            _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
        }
        else
        {
            for(size_t i = 0; i < sc.scalar.len; ++i)
            {
                if(sc.scalar.str[i] == '\n')
                {
                    _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
                    goto wrote_special;
                }
                // todo: check for escaped characters requiring double quotes
            }
            _write_scalar(sc.scalar, flags.is_quoted());
        wrote_special:
            ;
        }
    }
    else
    {
        _RYML_CB_ERR(m_tree->callbacks(), "not implemented");
    }
}